

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_exceptions.hpp
# Opt level: O0

void __thiscall CompoundFile::Exception::~Exception(Exception *this)

{
  runtime_error *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Exception_001577e8;
  std::__cxx11::wstring::~wstring((wstring *)(in_RDI + 0x10));
  std::runtime_error::~runtime_error(in_RDI);
  return;
}

Assistant:

inline
Exception::~Exception() noexcept
{
}